

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationbuilder.cpp
# Opt level: O0

void __thiscall
icu_63::CollationBuilder::CollationBuilder
          (CollationBuilder *this,CollationTailoring *b,UErrorCode *errorCode)

{
  UBool UVar1;
  Normalizer2 *pNVar2;
  Normalizer2Impl *pNVar3;
  CollationDataBuilder *this_00;
  uint32_t *rootElements;
  CollationDataBuilder *local_80;
  UErrorCode *errorCode_local;
  CollationTailoring *b_local;
  CollationBuilder *this_local;
  
  CollationRuleParser::Sink::Sink(&this->super_Sink);
  (this->super_Sink).super_UObject._vptr_UObject = (_func_int **)&PTR__CollationBuilder_004ac5b0;
  pNVar2 = Normalizer2::getNFDInstance(errorCode);
  this->nfd = pNVar2;
  pNVar2 = Normalizer2Factory::getFCDInstance(errorCode);
  this->fcd = pNVar2;
  pNVar3 = Normalizer2Factory::getNFCImpl(errorCode);
  this->nfcImpl = pNVar3;
  this->base = b;
  this->baseData = b->data;
  rootElements = b->data->rootElements;
  CollationRootElements::CollationRootElements
            (&this->rootElements,rootElements,b->data->rootElementsLength);
  this->variableTop = 0;
  this_00 = (CollationDataBuilder *)UMemory::operator_new((UMemory *)0x198,(size_t)rootElements);
  local_80 = (CollationDataBuilder *)0x0;
  if (this_00 != (CollationDataBuilder *)0x0) {
    CollationDataBuilder::CollationDataBuilder(this_00,errorCode);
    local_80 = this_00;
  }
  this->dataBuilder = local_80;
  this->fastLatinEnabled = '\x01';
  UnicodeSet::UnicodeSet(&this->optimizeSet);
  this->errorReason = (char *)0x0;
  this->cesLength = 0;
  UVector32::UVector32(&this->rootPrimaryIndexes,errorCode);
  UVector64::UVector64(&this->nodes,errorCode);
  Normalizer2Impl::ensureCanonIterData(this->nfcImpl,errorCode);
  UVar1 = ::U_FAILURE(*errorCode);
  if (UVar1 == '\0') {
    if (this->dataBuilder == (CollationDataBuilder *)0x0) {
      *errorCode = U_MEMORY_ALLOCATION_ERROR;
    }
    else {
      CollationDataBuilder::initForTailoring(this->dataBuilder,this->baseData,errorCode);
      UVar1 = ::U_FAILURE(*errorCode);
      if (UVar1 != '\0') {
        this->errorReason = "CollationBuilder initialization failed";
      }
    }
  }
  else {
    this->errorReason = "CollationBuilder fields initialization failed";
  }
  return;
}

Assistant:

CollationBuilder::CollationBuilder(const CollationTailoring *b, UErrorCode &errorCode)
        : nfd(*Normalizer2::getNFDInstance(errorCode)),
          fcd(*Normalizer2Factory::getFCDInstance(errorCode)),
          nfcImpl(*Normalizer2Factory::getNFCImpl(errorCode)),
          base(b),
          baseData(b->data),
          rootElements(b->data->rootElements, b->data->rootElementsLength),
          variableTop(0),
          dataBuilder(new CollationDataBuilder(errorCode)), fastLatinEnabled(TRUE),
          errorReason(NULL),
          cesLength(0),
          rootPrimaryIndexes(errorCode), nodes(errorCode) {
    nfcImpl.ensureCanonIterData(errorCode);
    if(U_FAILURE(errorCode)) {
        errorReason = "CollationBuilder fields initialization failed";
        return;
    }
    if(dataBuilder == NULL) {
        errorCode = U_MEMORY_ALLOCATION_ERROR;
        return;
    }
    dataBuilder->initForTailoring(baseData, errorCode);
    if(U_FAILURE(errorCode)) {
        errorReason = "CollationBuilder initialization failed";
    }
}